

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

void deqp::gles3::Functional::getAffineTexCoord3D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  pointer pfVar1;
  float *pfVar2;
  int row_2;
  long lVar3;
  int row;
  long lVar4;
  Vector<float,_3> *pVVar5;
  float *pfVar6;
  long lVar7;
  Vector<float,_3> *__return_storage_ptr__;
  float v;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  undefined4 uVar13;
  Vec3 p3;
  Vec3 p2;
  Vec3 p0;
  Vec3 p1;
  Mat3 rotMatrix;
  float local_e0 [4];
  undefined8 local_d0;
  float local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  Matrix<float,_3,_3> local_a8;
  undefined8 local_80;
  float local_78;
  Matrix<float,_3,_3> local_70;
  Vector<float,_3> local_4c [3];
  long lVar10;
  
  getBasicTexCoord3D(dst,cellNdx);
  pfVar2 = (float *)&local_a8;
  local_a8.m_data.m_data[1].m_data[1] = 0.0;
  local_a8.m_data.m_data[1].m_data[2] = 0.0;
  local_a8.m_data.m_data[2].m_data[0] = 0.0;
  local_a8.m_data.m_data[0].m_data[0] = 0.0;
  local_a8.m_data.m_data[0].m_data[1] = 0.0;
  local_a8.m_data.m_data[0].m_data[2] = 0.0;
  local_a8.m_data.m_data[1].m_data[0] = 0.0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar7 = 0;
    auVar11 = _DAT_00ada920;
    do {
      bVar12 = SUB164(auVar11 ^ _DAT_00ad8f80,4) == -0x80000000 &&
               SUB164(auVar11 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar3 + -0xc != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7 + 0xc) = uVar13;
      }
      lVar10 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar10 + 2;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x30);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0xc;
    pfVar2 = pfVar2 + 1;
  } while (lVar4 != 3);
  local_c0 = (float)cellNdx * 0.0625 * 6.2831855 + 0.0;
  local_b8 = -0.0;
  uStack_b4 = 0x80000000;
  uStack_b0 = 0x80000000;
  uStack_ac = 0x80000000;
  local_bc = cosf(local_c0);
  local_a8.m_data.m_data[1].m_data[2] = sinf(local_c0);
  local_a8.m_data.m_data[1].m_data[1] = local_bc;
  local_a8.m_data.m_data[2].m_data[1] = -local_a8.m_data.m_data[1].m_data[2];
  local_a8.m_data.m_data[2].m_data[2] = local_bc;
  pfVar2 = (float *)&local_70;
  local_70.m_data.m_data[0].m_data[2] = 0.0;
  local_70.m_data.m_data[2].m_data[0] = 0.0;
  local_70.m_data.m_data[2].m_data[1] = 0.0;
  local_70.m_data.m_data[0].m_data[1] = 0.0;
  local_70.m_data.m_data[1].m_data[0] = 0.0;
  local_70.m_data.m_data[1].m_data[1] = 0.0;
  lVar3 = 0;
  lVar4 = 0;
  local_70.m_data.m_data[1].m_data[2] = local_70.m_data.m_data[0].m_data[2];
  do {
    lVar7 = 0;
    auVar9 = _DAT_00ada920;
    do {
      bVar12 = (float)SUB164(auVar9 ^ _DAT_00ad8f80,4) == local_b8 &&
               SUB164(auVar9 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar3 + -0xc != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7 + 0xc) = uVar13;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x30);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0xc;
    pfVar2 = pfVar2 + 1;
  } while (lVar4 != 3);
  fVar8 = (float)cellNdx * 0.03125 * 6.2831855 + 1.0;
  local_b8 = cosf(fVar8);
  local_70.m_data.m_data[2].m_data[0] = sinf(fVar8);
  local_70.m_data.m_data[0].m_data[0] = local_b8;
  local_70.m_data.m_data[0].m_data[2] = -local_70.m_data.m_data[2].m_data[0];
  local_70.m_data.m_data[2].m_data[2] = local_b8;
  __return_storage_ptr__ = local_4c;
  tcu::operator*((Matrix<float,_3,_3> *)__return_storage_ptr__,&local_a8,&local_70);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_70.m_data.m_data[0].m_data[0] = (float)*(undefined8 *)pfVar1;
  local_70.m_data.m_data[0].m_data[1] = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
  local_70.m_data.m_data[0].m_data[2] = pfVar1[2];
  local_a8.m_data.m_data[0].m_data[0] = 0.0;
  local_a8.m_data.m_data[0].m_data[1] = 0.0;
  local_a8.m_data.m_data[0].m_data[2] = 0.0;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar4 = 0;
    pVVar5 = __return_storage_ptr__;
    do {
      fVar8 = fVar8 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0] *
                      local_70.m_data.m_data[0].m_data[lVar4];
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar4 != 3);
    local_a8.m_data.m_data[0].m_data[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
    __return_storage_ptr__ = (Vector<float,_3> *)(__return_storage_ptr__->m_data + 1);
  } while (lVar3 != 3);
  local_d0 = *(undefined8 *)(pfVar1 + 3);
  local_c8 = pfVar1[5];
  local_70.m_data.m_data[0].m_data[0] = 0.0;
  local_70.m_data.m_data[0].m_data[1] = 0.0;
  local_70.m_data.m_data[0].m_data[2] = 0.0;
  pfVar2 = local_4c[0].m_data;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar4 = 0;
    pfVar6 = pfVar2;
    do {
      fVar8 = fVar8 + ((Vector<float,_3> *)pfVar6)->m_data[0] *
                      *(float *)((long)&local_d0 + lVar4 * 4);
      lVar4 = lVar4 + 1;
      pfVar6 = (float *)((long)pfVar6 + 0xc);
    } while (lVar4 != 3);
    local_70.m_data.m_data[0].m_data[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar3 != 3);
  local_e0[0] = (float)*(undefined8 *)(pfVar1 + 6);
  local_e0[1] = (float)((ulong)*(undefined8 *)(pfVar1 + 6) >> 0x20);
  local_e0[2] = pfVar1[8];
  local_d0 = 0;
  local_c8 = 0.0;
  pfVar2 = local_4c[0].m_data;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar4 = 0;
    pfVar6 = pfVar2;
    do {
      fVar8 = fVar8 + ((Vector<float,_3> *)pfVar6)->m_data[0] * local_e0[lVar4];
      lVar4 = lVar4 + 1;
      pfVar6 = (float *)((long)pfVar6 + 0xc);
    } while (lVar4 != 3);
    *(float *)((long)&local_d0 + lVar3 * 4) = fVar8;
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar3 != 3);
  local_80 = *(undefined8 *)(pfVar1 + 9);
  local_78 = pfVar1[0xb];
  local_e0[0] = 0.0;
  local_e0[1] = 0.0;
  local_e0[2] = 0.0;
  pfVar2 = local_4c[0].m_data;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar4 = 0;
    pfVar6 = pfVar2;
    do {
      fVar8 = fVar8 + ((Vector<float,_3> *)pfVar6)->m_data[0] *
                      *(float *)((long)&local_80 + lVar4 * 4);
      lVar4 = lVar4 + 1;
      pfVar6 = (float *)((long)pfVar6 + 0xc);
    } while (lVar4 != 3);
    local_e0[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar3 != 3);
  *pfVar1 = local_a8.m_data.m_data[0].m_data[0];
  pfVar1[1] = local_a8.m_data.m_data[0].m_data[1];
  pfVar1[2] = local_a8.m_data.m_data[0].m_data[2];
  pfVar1[3] = local_70.m_data.m_data[0].m_data[0];
  *(ulong *)(pfVar1 + 4) =
       CONCAT44(local_70.m_data.m_data[0].m_data[2],local_70.m_data.m_data[0].m_data[1]);
  *(undefined8 *)(pfVar1 + 6) = local_d0;
  *(ulong *)(pfVar1 + 8) = CONCAT44(local_e0[0],local_c8);
  *(ulong *)(pfVar1 + 10) = CONCAT44(local_e0[2],local_e0[1]);
  return;
}

Assistant:

static void getAffineTexCoord3D (std::vector<float>& dst, int cellNdx)
{
	// Use basic coords as base.
	getBasicTexCoord3D(dst, cellNdx);

	// Rotate based on cell index.
	float		angleX		= 0.0f + 2.0f*DE_PI * ((float)cellNdx / 16.0f);
	float		angleY		= 1.0f + 2.0f*DE_PI * ((float)cellNdx / 32.0f);
	tcu::Mat3	rotMatrix	= tcu::rotationMatrixX(angleX) * tcu::rotationMatrixY(angleY);

	Vec3		p0			= rotMatrix * Vec3(dst[0], dst[ 1], dst[ 2]);
	Vec3		p1			= rotMatrix * Vec3(dst[3], dst[ 4], dst[ 5]);
	Vec3		p2			= rotMatrix * Vec3(dst[6], dst[ 7], dst[ 8]);
	Vec3		p3			= rotMatrix * Vec3(dst[9], dst[10], dst[11]);

	dst[0] = p0.x();	dst[ 1] = p0.y();	dst[ 2] = p0.z();
	dst[3] = p1.x();	dst[ 4] = p1.y();	dst[ 5] = p1.z();
	dst[6] = p2.x();	dst[ 7] = p2.y();	dst[ 8] = p2.z();
	dst[9] = p3.x();	dst[10] = p3.y();	dst[11] = p3.z();
}